

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar_p.h
# Opt level: O0

void __thiscall QMenuBarPrivate::QMenuBarPrivate(QMenuBarPrivate *this)

{
  QWidgetPrivate *in_RDI;
  nullptr_t in_stack_ffffffffffffffe8;
  
  QWidgetPrivate::QWidgetPrivate(in_RDI,(QtPrivate_6_10_0)((ulong)in_RDI >> 0x20));
  *(undefined ***)in_RDI = &PTR__QMenuBarPrivate_00d18a00;
  in_RDI->field_0x254 = in_RDI->field_0x254 & 0xfe;
  QList<int>::QList((QList<int> *)0x660f80);
  QList<QRect>::QList((QList<QRect> *)0x660f91);
  QPointer<QAction>::QPointer((QPointer<QAction> *)in_RDI,in_stack_ffffffffffffffe8);
  in_RDI[1].field_0x40 = in_RDI[1].field_0x40 & 0xfe;
  in_RDI[1].field_0x40 = in_RDI[1].field_0x40 & 0xfd;
  *(undefined4 *)&in_RDI[1].field_0x44 = 1;
  in_RDI[1].field_0x48 = in_RDI[1].field_0x48 & 0xfe;
  QPointer<QMenu>::QPointer((QPointer<QMenu> *)0x660ff1);
  in_RDI[1].field_0x60 = in_RDI[1].field_0x60 & 0xfe;
  in_RDI[1].field_0x60 = in_RDI[1].field_0x60 & 0xfd;
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x661022);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x661033);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x661044);
  *(undefined1 *)&in_RDI[1].needsFlush = 0;
  QList<QPointer<QWidget>_>::QList((QList<QPointer<QWidget>_> *)0x66105c);
  QList<QAction_*>::QList((QList<QAction_*> *)0x66106d);
  QPointer<QAction>::QPointer((QPointer<QAction> *)0x66107e);
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[1].toolTip);
  in_RDI[1].toolTip.d.ptr = (char16_t *)0x0;
  return;
}

Assistant:

QMenuBarPrivate() : itemsDirty(0), currentAction(nullptr), mouseDown(0),
                         closePopupMode(0), defaultPopDown(1), popupState(0), keyboardState(0), altPressed(0),
                         doChildEffects(false), platformMenuBar(nullptr)
    { }